

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cc
# Opt level: O2

bool __thiscall ConfigFile::load(ConfigFile *this,string *path)

{
  char cVar1;
  ssize_t sVar2;
  Stream *pSVar3;
  size_t in_RCX;
  void *__buf;
  undefined1 uVar4;
  allocator<char> local_241;
  undefined1 local_240 [40];
  ifstream file;
  
  std::ifstream::ifstream(&file,(string *)path,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_240 + 8),"config",&local_241);
    Log::Logger::operator[]((Logger *)local_240,(string *)&Log::Error);
    pSVar3 = Log::Stream::operator<<((Stream *)local_240,"Failed to open config file \'");
    pSVar3 = Log::Stream::operator<<(pSVar3,path);
    Log::Stream::operator<<(pSVar3,"\'");
    Log::Stream::~Stream((Stream *)local_240);
    std::__cxx11::string::~string((string *)(local_240 + 8));
    uVar4 = 0;
  }
  else {
    sVar2 = read(this,(int)&file,__buf,in_RCX);
    uVar4 = (undefined1)sVar2;
  }
  std::ifstream::~ifstream(&file);
  return (bool)uVar4;
}

Assistant:

bool
ConfigFile::load(const std::string &path) {
  std::ifstream file(path);
  if (!file.is_open()) {
    Log::Error["config"] << "Failed to open config file '" << path << "'";
    return false;
  }

  return read(&file);
}